

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_compressBlock_fast_extDict_generic
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize,
                 U32 mls)

{
  ulong *iEnd;
  int *piVar1;
  ulong *puVar2;
  undefined8 *puVar3;
  BYTE *pBVar4;
  U32 *pUVar5;
  BYTE *pBVar6;
  uint uVar7;
  undefined8 uVar8;
  char cVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  size_t sVar13;
  ulong *puVar14;
  ulong *ilimit_w;
  seqDef *psVar15;
  byte bVar16;
  byte bVar17;
  uint uVar18;
  int *piVar19;
  ulong *puVar20;
  ulong uVar21;
  long *plVar22;
  ulong *puVar23;
  ulong *puVar24;
  ulong *puVar25;
  ulong uVar26;
  int iVar27;
  BYTE *pBVar28;
  long lVar29;
  long lVar30;
  BYTE *pBVar31;
  ulong *puVar32;
  uint uVar33;
  uint uVar34;
  int *piVar35;
  ulong uVar36;
  int iVar37;
  uint uVar38;
  uint uVar39;
  ulong uVar40;
  U32 UVar41;
  ulong uVar42;
  int iVar43;
  ulong uVar44;
  BYTE *litLimit_w;
  BYTE *pInLoopLimit;
  ulong local_a8;
  
  uVar10 = (ms->cParams).targetLength;
  uVar10 = uVar10 + (uVar10 == 0);
  pBVar4 = (ms->window).base;
  iEnd = (ulong *)((long)src + srcSize);
  iVar43 = (int)pBVar4;
  iVar37 = (int)iEnd - iVar43;
  uVar33 = (ms->window).lowLimit;
  uVar34 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar7 = uVar33;
  if (uVar34 < iVar37 - uVar33) {
    uVar7 = iVar37 - uVar34;
  }
  pUVar5 = ms->hashTable;
  if (ms->loadedDictEnd != 0) {
    uVar7 = uVar33;
  }
  puVar2 = (ulong *)((long)src + (srcSize - 8));
  uVar33 = (ms->window).dictLimit;
  uVar39 = *rep;
  uVar38 = rep[1];
  cVar9 = (char)(ms->cParams).hashLog;
  if (uVar7 < uVar33) {
    if (src < puVar2) {
      pBVar6 = (ms->window).dictBase;
      piVar1 = (int *)(pBVar4 + uVar33);
      puVar25 = (ulong *)(pBVar6 + uVar33);
      bVar16 = 0x20 - cVar9;
      puVar20 = iEnd + -4;
      uVar34 = mls - 5;
      uVar40 = (ulong)uVar34;
      puVar23 = (ulong *)src;
      do {
        if (uVar34 < 4) {
          sVar13 = (*(code *)(&DAT_0019f428 + *(int *)(&DAT_0019f428 + uVar40 * 4)))();
          return sVar13;
        }
        uVar11 = (uint)((int)*puVar23 * -0x61c8864f) >> (bVar16 & 0x1f);
        uVar12 = pUVar5[uVar11];
        pBVar31 = pBVar4;
        if (uVar12 < uVar33) {
          pBVar31 = pBVar6;
        }
        uVar44 = (long)puVar23 - (long)pBVar4;
        UVar41 = (U32)uVar44;
        uVar18 = UVar41 + 1;
        pBVar28 = pBVar4;
        if (uVar18 - uVar39 < uVar33) {
          pBVar28 = pBVar6;
        }
        pUVar5[uVar11] = UVar41;
        uVar11 = uVar18 - uVar39;
        if (uVar18 < uVar39) {
          __assert_fail("offset_1 <= current +1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x3e88,
                        "size_t ZSTD_compressBlock_fast_extDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                       );
        }
        if (((uVar7 < uVar11) && (2 < (uVar33 - 1) - uVar11)) &&
           (*(int *)(pBVar28 + (uVar18 - uVar39)) == *(int *)((long)puVar23 + 1))) {
          puVar14 = iEnd;
          if (uVar11 < uVar33) {
            puVar14 = puVar25;
          }
          sVar13 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar23 + 5),
                              (BYTE *)((long)(pBVar28 + (uVar18 - uVar39)) + 4),(BYTE *)iEnd,
                              (BYTE *)puVar14,(BYTE *)piVar1);
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_00155384;
          if (0x20000 < seqStore->maxNbLit) goto LAB_001553a3;
          puVar23 = (ulong *)((long)puVar23 + 1);
          uVar42 = (long)puVar23 - (long)src;
          puVar14 = (ulong *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar14 + uVar42))
          goto LAB_00155346;
          if (iEnd < puVar23) goto LAB_00155365;
          if (puVar20 < puVar23) {
            ZSTD_safecopyLiterals((BYTE *)puVar14,(BYTE *)src,(BYTE *)puVar23,(BYTE *)puVar20);
LAB_00154263:
            seqStore->lit = seqStore->lit + uVar42;
            if (0xffff < uVar42) {
              if (seqStore->longLengthID != 0) goto LAB_0015541f;
              seqStore->longLengthID = 1;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            uVar36 = *(ulong *)((long)src + 8);
            *puVar14 = *src;
            puVar14[1] = uVar36;
            pBVar31 = seqStore->lit;
            if (0x10 < uVar42) {
              lVar29 = (long)(pBVar31 + 0x10) - ((long)src + 0x10);
              if (lVar29 < 8) {
                if (-0x10 < lVar29) goto LAB_0015547c;
              }
              else if (0xffffffffffffffe0 < lVar29 - 0x10U) goto LAB_0015549b;
              uVar36 = *(ulong *)((long)src + 0x18);
              *(ulong *)(pBVar31 + 0x10) = *(ulong *)((long)src + 0x10);
              *(ulong *)(pBVar31 + 0x18) = uVar36;
              if (0x20 < (long)uVar42) {
                lVar29 = 0;
                do {
                  puVar3 = (undefined8 *)((long)src + lVar29 + 0x20);
                  uVar8 = puVar3[1];
                  pBVar28 = pBVar31 + lVar29 + 0x20;
                  *(undefined8 *)pBVar28 = *puVar3;
                  *(undefined8 *)(pBVar28 + 8) = uVar8;
                  puVar3 = (undefined8 *)((long)src + lVar29 + 0x30);
                  uVar8 = puVar3[1];
                  *(undefined8 *)(pBVar28 + 0x10) = *puVar3;
                  *(undefined8 *)(pBVar28 + 0x18) = uVar8;
                  lVar29 = lVar29 + 0x20;
                } while (pBVar28 + 0x20 < pBVar31 + uVar42);
              }
              goto LAB_00154263;
            }
            seqStore->lit = pBVar31 + uVar42;
          }
          psVar15 = seqStore->sequences;
          psVar15->litLength = (U16)uVar42;
          psVar15->offset = 1;
          if (0xffff < sVar13 + 1) {
            if (seqStore->longLengthID != 0) goto LAB_001553c2;
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar15 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar15->matchLength = (U16)(sVar13 + 1);
          psVar15 = psVar15 + 1;
          seqStore->sequences = psVar15;
          puVar23 = (ulong *)((long)puVar23 + sVar13 + 4);
LAB_001545b9:
          src = puVar23;
          if (puVar23 <= puVar2) {
            if (uVar34 < 4) {
              sVar13 = (*(code *)(&DAT_0019f438 + *(int *)(&DAT_0019f438 + uVar40 * 4)))
                                 (uVar40,UVar41 + 2,
                                  &DAT_0019f438 + *(int *)(&DAT_0019f438 + uVar40 * 4));
              return sVar13;
            }
            pUVar5[(uint)(*(int *)(pBVar4 + (uVar44 & 0xffffffff) + 2) * -0x61c8864f) >>
                   (bVar16 & 0x1f)] = UVar41 + 2;
            pUVar5[(uint)(*(int *)((long)puVar23 + -2) * -0x61c8864f) >> (bVar16 & 0x1f)] =
                 ((int)puVar23 + -2) - iVar43;
            do {
              uVar12 = uVar39;
              UVar41 = (int)puVar23 - iVar43;
              uVar11 = UVar41 - uVar38;
              pBVar31 = pBVar4;
              if (uVar11 < uVar33) {
                pBVar31 = pBVar6;
              }
              src = puVar23;
              uVar39 = uVar12;
              if (((uVar11 <= uVar7) || ((uVar33 - 1) - uVar11 < 3)) ||
                 (*(int *)(pBVar31 + uVar11) != (int)*puVar23)) break;
              puVar14 = iEnd;
              if (uVar11 < uVar33) {
                puVar14 = puVar25;
              }
              sVar13 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar23 + 4),(BYTE *)((long)(pBVar31 + uVar11) + 4)
                                  ,(BYTE *)iEnd,(BYTE *)puVar14,(BYTE *)piVar1);
              if (seqStore->maxNbSeq <= (ulong)((long)psVar15 - (long)seqStore->sequencesStart >> 3)
                 ) goto LAB_00155384;
              if (0x20000 < seqStore->maxNbLit) goto LAB_001553a3;
              puVar14 = (ulong *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < puVar14) goto LAB_00155346;
              if (iEnd < puVar23) goto LAB_00155365;
              if (puVar20 < puVar23) {
                ZSTD_safecopyLiterals
                          ((BYTE *)puVar14,(BYTE *)puVar23,(BYTE *)puVar23,(BYTE *)puVar20);
              }
              else {
                uVar44 = puVar23[1];
                *puVar14 = *puVar23;
                puVar14[1] = uVar44;
              }
              psVar15 = seqStore->sequences;
              psVar15->litLength = 0;
              psVar15->offset = 1;
              if (0xffff < sVar13 + 1) {
                if (seqStore->longLengthID != 0) goto LAB_001553c2;
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar15 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar15->matchLength = (U16)(sVar13 + 1);
              psVar15 = psVar15 + 1;
              seqStore->sequences = psVar15;
              if (uVar34 < 4) {
                sVar13 = (*(code *)(&DAT_0019f448 + *(int *)(&DAT_0019f448 + uVar40 * 4)))();
                return sVar13;
              }
              pUVar5[(uint)((int)*puVar23 * -0x61c8864f) >> (bVar16 & 0x1f)] = UVar41;
              puVar23 = (ulong *)((long)puVar23 + sVar13 + 4);
              src = puVar23;
              uVar39 = uVar38;
              uVar38 = uVar12;
            } while (puVar23 <= puVar2);
          }
        }
        else {
          if ((uVar7 <= uVar12) && (piVar19 = (int *)(pBVar31 + uVar12), *piVar19 == (int)*puVar23))
          {
            piVar35 = piVar1;
            puVar14 = iEnd;
            if (uVar12 < uVar33) {
              piVar35 = (int *)(pBVar6 + uVar7);
              puVar14 = puVar25;
            }
            sVar13 = ZSTD_count_2segments
                               ((BYTE *)((long)puVar23 + 4),(BYTE *)(piVar19 + 1),(BYTE *)iEnd,
                                (BYTE *)puVar14,(BYTE *)piVar1);
            lVar29 = sVar13 + 4;
            if ((piVar35 < piVar19) && (src < puVar23)) {
              piVar19 = (int *)(pBVar31 + uVar12);
              do {
                piVar19 = (int *)((long)piVar19 + -1);
                puVar14 = (ulong *)((long)puVar23 + -1);
                if ((*(BYTE *)puVar14 != *(BYTE *)piVar19) ||
                   (lVar29 = lVar29 + 1, puVar23 = puVar14, piVar19 <= piVar35)) break;
              } while (src < puVar14);
            }
            if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
                seqStore->maxNbSeq) {
              if (seqStore->maxNbLit < 0x20001) {
                uVar42 = (long)puVar23 - (long)src;
                puVar14 = (ulong *)seqStore->lit;
                if ((BYTE *)((long)puVar14 + uVar42) <= seqStore->litStart + seqStore->maxNbLit) {
                  if (puVar23 <= iEnd) {
                    if (puVar20 < puVar23) {
                      ZSTD_safecopyLiterals
                                ((BYTE *)puVar14,(BYTE *)src,(BYTE *)puVar23,(BYTE *)puVar20);
LAB_001544d2:
                      seqStore->lit = seqStore->lit + uVar42;
                      if (0xffff < uVar42) {
                        if (seqStore->longLengthID != 0) goto LAB_0015541f;
                        seqStore->longLengthID = 1;
                        seqStore->longLengthPos =
                             (U32)((ulong)((long)seqStore->sequences -
                                          (long)seqStore->sequencesStart) >> 3);
                      }
                    }
                    else {
                      uVar36 = *(ulong *)((long)src + 8);
                      *puVar14 = *src;
                      puVar14[1] = uVar36;
                      pBVar31 = seqStore->lit;
                      if (0x10 < uVar42) {
                        lVar30 = (long)(pBVar31 + 0x10) - ((long)src + 0x10);
                        if (lVar30 < 8) {
                          if (-0x10 < lVar30) goto LAB_0015547c;
                        }
                        else if (0xffffffffffffffe0 < lVar30 - 0x10U) goto LAB_0015549b;
                        uVar36 = *(ulong *)((long)src + 0x18);
                        *(ulong *)(pBVar31 + 0x10) = *(ulong *)((long)src + 0x10);
                        *(ulong *)(pBVar31 + 0x18) = uVar36;
                        if (0x20 < (long)uVar42) {
                          lVar30 = 0;
                          do {
                            puVar3 = (undefined8 *)((long)src + lVar30 + 0x20);
                            uVar8 = puVar3[1];
                            pBVar28 = pBVar31 + lVar30 + 0x20;
                            *(undefined8 *)pBVar28 = *puVar3;
                            *(undefined8 *)(pBVar28 + 8) = uVar8;
                            puVar3 = (undefined8 *)((long)src + lVar30 + 0x30);
                            uVar8 = puVar3[1];
                            *(undefined8 *)(pBVar28 + 0x10) = *puVar3;
                            *(undefined8 *)(pBVar28 + 0x18) = uVar8;
                            lVar30 = lVar30 + 0x20;
                          } while (pBVar28 + 0x20 < pBVar31 + uVar42);
                        }
                        goto LAB_001544d2;
                      }
                      seqStore->lit = pBVar31 + uVar42;
                    }
                    psVar15 = seqStore->sequences;
                    psVar15->litLength = (U16)uVar42;
                    psVar15->offset = (UVar41 - uVar12) + 3;
                    if (0xffff < lVar29 - 3U) {
                      if (seqStore->longLengthID != 0) goto LAB_001553c2;
                      seqStore->longLengthID = 2;
                      seqStore->longLengthPos =
                           (U32)((ulong)((long)psVar15 - (long)seqStore->sequencesStart) >> 3);
                    }
                    psVar15->matchLength = (U16)(lVar29 - 3U);
                    psVar15 = psVar15 + 1;
                    seqStore->sequences = psVar15;
                    puVar23 = (ulong *)((long)puVar23 + lVar29);
                    uVar38 = uVar39;
                    uVar39 = UVar41 - uVar12;
                    goto LAB_001545b9;
                  }
                  goto LAB_00155365;
                }
                goto LAB_00155346;
              }
              goto LAB_001553a3;
            }
            goto LAB_00155384;
          }
          puVar23 = (ulong *)((long)puVar23 + ((long)puVar23 - (long)src >> 8) + (ulong)uVar10);
        }
      } while (puVar23 < puVar2);
    }
    *rep = uVar39;
    puVar25 = (ulong *)src;
  }
  else {
    uVar7 = iVar37 - uVar34;
    if (iVar37 - uVar33 <= uVar34) {
      uVar7 = uVar33;
    }
    piVar1 = (int *)(pBVar4 + uVar7);
    puVar23 = (ulong *)((ulong)(piVar1 == (int *)src) + (long)src);
    uVar34 = (int)puVar23 - (int)piVar1;
    uVar33 = 0;
    if (uVar34 < uVar38) {
      uVar33 = uVar38;
    }
    puVar20 = (ulong *)((long)src + (ulong)(piVar1 == (int *)src) + 1);
    uVar40 = (ulong)uVar38;
    if (uVar34 < uVar38) {
      uVar40 = 0;
    }
    uVar38 = (uint)uVar40;
    if (uVar34 < uVar39) {
      uVar33 = uVar39;
    }
    uVar44 = (ulong)uVar39;
    if (uVar34 < uVar39) {
      uVar44 = 0;
    }
    uVar34 = (uint)uVar44;
    puVar25 = (ulong *)src;
    if (puVar20 < puVar2) {
      bVar16 = 0x40 - cVar9;
      bVar17 = 0x20 - cVar9;
      puVar14 = (ulong *)((long)iEnd - 7);
      ilimit_w = iEnd + -4;
      do {
        iVar37 = mls - 5;
        switch(iVar37) {
        case 0:
          local_a8 = *puVar23;
          lVar29 = -0x30e4432345000000;
          break;
        case 1:
          local_a8 = *puVar23;
          lVar29 = -0x30e4432340650000;
          break;
        case 2:
          local_a8 = *puVar23;
          lVar29 = -0x30e44323405a9d00;
          break;
        case 3:
          local_a8 = *puVar23;
          uVar42 = local_a8 * -0x30e44323485a9b9d >> (bVar16 & 0x3f);
          uVar26 = *puVar20;
          uVar36 = uVar26 * -0x30e44323485a9b9d;
          goto LAB_00154ad5;
        default:
          local_a8._0_4_ = (int)*puVar23;
          uVar42 = (ulong)((uint)((int)local_a8 * -0x61c8864f) >> (bVar17 & 0x1f));
          iVar27 = (int)*puVar20;
          uVar36 = (ulong)((uint)(iVar27 * -0x61c8864f) >> (bVar17 & 0x1f));
          goto LAB_00154ad8;
        }
        uVar42 = local_a8 * lVar29 >> (bVar16 & 0x3f);
        uVar26 = *puVar20;
        uVar36 = lVar29 * uVar26;
LAB_00154ad5:
        iVar27 = (int)uVar26;
        uVar36 = uVar36 >> (bVar16 & 0x3f);
LAB_00154ad8:
        uVar26 = (long)puVar23 - (long)pBVar4;
        uVar34 = pUVar5[uVar42];
        uVar39 = pUVar5[uVar36];
        UVar41 = (U32)uVar26;
        pUVar5[uVar42] = UVar41;
        pUVar5[uVar36] = (int)puVar20 - iVar43;
        if ((ulong *)((long)puVar23 + 1) != puVar20) {
          __assert_fail("ip0 + 1 == ip1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x3d56,
                        "size_t ZSTD_compressBlock_fast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                       );
        }
        uVar38 = (uint)uVar44;
        if (uVar38 == 0) {
LAB_00154b63:
          if (((uVar7 < uVar34) &&
              (piVar35 = (int *)(pBVar4 + uVar34), puVar32 = puVar23, *piVar35 == (int)local_a8)) ||
             ((uVar7 < uVar39 &&
              (piVar35 = (int *)(pBVar4 + uVar39), puVar32 = puVar20, *piVar35 == iVar27)))) {
            uVar34 = (int)puVar32 - (int)piVar35;
            uVar44 = (ulong)uVar34;
            iVar27 = uVar34 + 2;
            if ((piVar1 < piVar35) && (puVar25 < puVar32)) {
              uVar42 = 0;
              do {
                piVar19 = (int *)((long)piVar35 + -1);
                puVar23 = (ulong *)((long)puVar32 + -1);
                if ((*(BYTE *)puVar23 != *(BYTE *)piVar19) ||
                   (uVar42 = uVar42 + 1, piVar35 = piVar19, puVar32 = puVar23, piVar19 <= piVar1))
                break;
              } while (puVar25 < puVar23);
            }
            else {
              uVar42 = 0;
            }
            goto LAB_00154c6c;
          }
          uVar42 = ((ulong)((long)puVar23 - (long)puVar25) >> 7) + (ulong)(uVar10 + 1);
          if (uVar42 < 2) {
            __assert_fail("step >= 2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x3d6a,
                          "size_t ZSTD_compressBlock_fast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                         );
          }
          puVar23 = (ulong *)((long)puVar23 + uVar42);
          puVar20 = (ulong *)((long)puVar20 + uVar42);
        }
        else {
          piVar19 = (int *)((long)puVar23 + 2);
          piVar35 = (int *)((long)piVar19 - uVar44);
          if (*piVar35 != *piVar19) goto LAB_00154b63;
          uVar42 = (ulong)(*(BYTE *)((long)puVar23 + 1) == *(BYTE *)((long)piVar35 + -1));
          iVar27 = 0;
          piVar35 = (int *)((long)piVar35 - uVar42);
          puVar32 = (ulong *)((long)piVar19 - uVar42);
          uVar38 = (uint)uVar40;
LAB_00154c6c:
          puVar20 = (ulong *)((long)puVar32 + uVar42 + 4);
          puVar24 = (ulong *)((long)piVar35 + uVar42 + 4);
          puVar23 = puVar20;
          if (puVar20 < puVar14) {
            if (*puVar24 == *puVar20) {
              lVar29 = 0;
              do {
                puVar23 = (ulong *)((long)puVar32 + lVar29 + uVar42 + 0xc);
                if (puVar14 <= puVar23) {
                  puVar24 = (ulong *)((long)piVar35 + lVar29 + uVar42 + 0xc);
                  puVar23 = (ulong *)((long)puVar32 + lVar29 + uVar42 + 0xc);
                  goto LAB_00154cf9;
                }
                uVar40 = *(ulong *)((long)piVar35 + lVar29 + uVar42 + 0xc);
                uVar36 = *puVar23;
                lVar29 = lVar29 + 8;
              } while (uVar40 == uVar36);
              uVar36 = uVar36 ^ uVar40;
              uVar40 = 0;
              if (uVar36 != 0) {
                for (; (uVar36 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                }
              }
              uVar36 = (uVar40 >> 3 & 0x1fffffff) + lVar29;
            }
            else {
              uVar36 = *puVar20 ^ *puVar24;
              uVar40 = 0;
              if (uVar36 != 0) {
                for (; (uVar36 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                }
              }
              uVar36 = uVar40 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_00154cf9:
            if ((puVar23 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar24 == (int)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 4);
              puVar24 = (ulong *)((long)puVar24 + 4);
            }
            if ((puVar23 < (ulong *)((long)iEnd - 1U)) && ((short)*puVar24 == (short)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 2);
              puVar24 = (ulong *)((long)puVar24 + 2);
            }
            if (puVar23 < iEnd) {
              puVar23 = (ulong *)((long)puVar23 + (ulong)((BYTE)*puVar24 == (BYTE)*puVar23));
            }
            uVar36 = (long)puVar23 - (long)puVar20;
          }
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_00155384:
            __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2038,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (0x20000 < seqStore->maxNbLit) {
LAB_001553a3:
            __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203a,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          uVar40 = (long)puVar32 - (long)puVar25;
          puVar23 = (ulong *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar23 + uVar40)) {
LAB_00155346:
            __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203b,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (iEnd < puVar32) {
LAB_00155365:
            __assert_fail("literals + litLength <= litLimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203c,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (ilimit_w < puVar32) {
            ZSTD_safecopyLiterals((BYTE *)puVar23,(BYTE *)puVar25,(BYTE *)puVar32,(BYTE *)ilimit_w);
LAB_00154dc1:
            seqStore->lit = seqStore->lit + uVar40;
            if (0xffff < uVar40) {
              if (seqStore->longLengthID != 0) {
LAB_0015541f:
                __assert_fail("seqStorePtr->longLengthID == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x204d,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              seqStore->longLengthID = 1;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            uVar21 = puVar25[1];
            *puVar23 = *puVar25;
            puVar23[1] = uVar21;
            pBVar6 = seqStore->lit;
            if (0x10 < uVar40) {
              lVar29 = (long)(pBVar6 + 0x10) - (long)(puVar25 + 2);
              if (lVar29 < 8) {
                if (-0x10 < lVar29) {
LAB_0015547c:
                  __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x1268,
                                "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                               );
                }
              }
              else if (0xffffffffffffffe0 < lVar29 - 0x10U) {
LAB_0015549b:
                __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x1270,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
              uVar21 = puVar25[3];
              *(ulong *)(pBVar6 + 0x10) = puVar25[2];
              *(ulong *)(pBVar6 + 0x18) = uVar21;
              if (0x20 < (long)uVar40) {
                lVar29 = 0;
                do {
                  puVar3 = (undefined8 *)((long)puVar25 + lVar29 + 0x20);
                  uVar8 = puVar3[1];
                  pBVar31 = pBVar6 + lVar29 + 0x20;
                  *(undefined8 *)pBVar31 = *puVar3;
                  *(undefined8 *)(pBVar31 + 8) = uVar8;
                  puVar3 = (undefined8 *)((long)puVar25 + lVar29 + 0x30);
                  uVar8 = puVar3[1];
                  *(undefined8 *)(pBVar31 + 0x10) = *puVar3;
                  *(undefined8 *)(pBVar31 + 0x18) = uVar8;
                  lVar29 = lVar29 + 0x20;
                } while (pBVar31 + 0x20 < pBVar6 + uVar40);
              }
              goto LAB_00154dc1;
            }
            seqStore->lit = pBVar6 + uVar40;
          }
          uVar21 = uVar42 + uVar36 + 1;
          psVar15 = seqStore->sequences;
          psVar15->litLength = (U16)uVar40;
          psVar15->offset = iVar27 + 1;
          uVar40 = (ulong)uVar38;
          if (0xffff < uVar21) {
            if (seqStore->longLengthID != 0) {
LAB_001553c2:
              __assert_fail("seqStorePtr->longLengthID == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x2058,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar15 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar15->matchLength = (U16)uVar21;
          psVar15 = psVar15 + 1;
          seqStore->sequences = psVar15;
          puVar23 = (ulong *)((long)puVar32 + uVar42 + uVar36 + 4);
          puVar20 = (ulong *)((long)puVar32 + uVar42 + uVar36 + 5);
          puVar25 = puVar23;
          if (puVar2 < puVar23) goto LAB_001552a9;
          plVar22 = (long *)(pBVar4 + (uVar26 & 0xffffffff) + 2);
          if (plVar22 <= src) {
            __assert_fail("base+current0+2 > istart",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x3d84,
                          "size_t ZSTD_compressBlock_fast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                         );
          }
          UVar41 = UVar41 + 2;
          switch(iVar37) {
          case 0:
            lVar29 = -0x30e4432345000000;
            break;
          case 1:
            lVar29 = -0x30e4432340650000;
            break;
          case 2:
            lVar29 = -0x30e44323405a9d00;
            break;
          case 3:
            pUVar5[(ulong)(*plVar22 * -0x30e44323485a9b9d) >> (bVar16 & 0x3f)] = UVar41;
            uVar42 = *(long *)((long)puVar23 + -2) * -0x30e44323485a9b9d;
            goto LAB_00154fe3;
          default:
            pUVar5[(uint)((int)*plVar22 * -0x61c8864f) >> (bVar17 & 0x1f)] = UVar41;
            uVar42 = (ulong)((uint)(*(int *)((long)puVar23 + -2) * -0x61c8864f) >> (bVar17 & 0x1f));
            goto LAB_00154feb;
          }
          pUVar5[(ulong)(*plVar22 * lVar29) >> (bVar16 & 0x3f)] = UVar41;
          uVar42 = lVar29 * *(long *)((long)puVar23 + -2);
LAB_00154fe3:
          uVar42 = uVar42 >> (bVar16 & 0x3f);
LAB_00154feb:
          pUVar5[uVar42] = ((int)puVar23 + -2) - iVar43;
          if (uVar38 == 0) {
            uVar40 = 0;
          }
          else {
            iVar27 = (int)*puVar23;
            uVar42 = uVar40;
            if (iVar27 == *(int *)((long)puVar23 - uVar40)) {
              do {
                uVar40 = uVar44;
                uVar44 = uVar42;
                lVar29 = -uVar44;
                puVar25 = (ulong *)((long)puVar23 + 4);
                puVar32 = (ulong *)((long)puVar23 + lVar29 + 4);
                puVar20 = puVar25;
                if (puVar25 < puVar14) {
                  if (*puVar32 == *puVar25) {
                    lVar30 = 0;
                    do {
                      puVar20 = (ulong *)((long)puVar23 + lVar30 + 0xc);
                      if (puVar14 <= puVar20) {
                        puVar32 = (ulong *)((long)puVar23 + lVar29 + lVar30 + 0xc);
                        puVar20 = (ulong *)((long)puVar23 + lVar30 + 0xc);
                        goto LAB_001550ca;
                      }
                      uVar42 = *(ulong *)((long)puVar23 + lVar30 + lVar29 + 0xc);
                      uVar36 = *puVar20;
                      lVar30 = lVar30 + 8;
                    } while (uVar42 == uVar36);
                    uVar36 = uVar36 ^ uVar42;
                    uVar42 = 0;
                    if (uVar36 != 0) {
                      for (; (uVar36 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                      }
                    }
                    uVar42 = (uVar42 >> 3 & 0x1fffffff) + lVar30;
                  }
                  else {
                    uVar36 = *puVar25 ^ *puVar32;
                    uVar42 = 0;
                    if (uVar36 != 0) {
                      for (; (uVar36 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                      }
                    }
                    uVar42 = uVar42 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_001550ca:
                  if ((puVar20 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar32 == (int)*puVar20)) {
                    puVar20 = (ulong *)((long)puVar20 + 4);
                    puVar32 = (ulong *)((long)puVar32 + 4);
                  }
                  if ((puVar20 < (ulong *)((long)iEnd - 1U)) && ((short)*puVar32 == (short)*puVar20)
                     ) {
                    puVar20 = (ulong *)((long)puVar20 + 2);
                    puVar32 = (ulong *)((long)puVar32 + 2);
                  }
                  if (puVar20 < iEnd) {
                    puVar20 = (ulong *)((long)puVar20 + (ulong)((BYTE)*puVar32 == (BYTE)*puVar20));
                  }
                  uVar42 = (long)puVar20 - (long)puVar25;
                }
                switch(iVar37) {
                case 0:
                  lVar29 = -0x30e4432345000000;
                  break;
                case 1:
                  lVar29 = -0x30e4432340650000;
                  break;
                case 2:
                  lVar29 = -0x30e44323405a9d00;
                  break;
                case 3:
                  uVar36 = *puVar23 * -0x30e44323485a9b9d;
                  goto LAB_0015517c;
                default:
                  uVar36 = (ulong)((uint)(iVar27 * -0x61c8864f) >> (bVar17 & 0x1f));
                  goto LAB_00155184;
                }
                uVar36 = lVar29 * *puVar23;
LAB_0015517c:
                uVar36 = uVar36 >> (bVar16 & 0x3f);
LAB_00155184:
                pUVar5[uVar36] = (int)puVar23 - iVar43;
                if (seqStore->maxNbSeq <=
                    (ulong)((long)psVar15 - (long)seqStore->sequencesStart >> 3)) goto LAB_00155384;
                if (0x20000 < seqStore->maxNbLit) goto LAB_001553a3;
                puVar25 = (ulong *)seqStore->lit;
                if (seqStore->litStart + seqStore->maxNbLit < puVar25) goto LAB_00155346;
                if (iEnd < puVar23) goto LAB_00155365;
                if (ilimit_w < puVar23) {
                  ZSTD_safecopyLiterals
                            ((BYTE *)puVar25,(BYTE *)puVar23,(BYTE *)puVar23,(BYTE *)ilimit_w);
                }
                else {
                  uVar36 = puVar23[1];
                  *puVar25 = *puVar23;
                  puVar25[1] = uVar36;
                }
                psVar15 = seqStore->sequences;
                psVar15->litLength = 0;
                psVar15->offset = 1;
                if (0xffff < uVar42 + 1) {
                  if (seqStore->longLengthID != 0) goto LAB_001553c2;
                  seqStore->longLengthID = 2;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar15 - (long)seqStore->sequencesStart) >> 3);
                }
                puVar23 = (ulong *)((long)puVar23 + uVar42 + 4);
                psVar15->matchLength = (U16)(uVar42 + 1);
                psVar15 = psVar15 + 1;
                seqStore->sequences = psVar15;
              } while ((((int)uVar40 != 0) && (puVar23 <= puVar2)) &&
                      (iVar27 = (int)*puVar23, uVar42 = uVar40,
                      iVar27 == *(int *)((long)puVar23 - uVar40)));
              puVar20 = (ulong *)((long)puVar23 + 1);
              puVar25 = puVar23;
            }
          }
        }
LAB_001552a9:
        uVar38 = (uint)uVar40;
        uVar34 = (uint)uVar44;
      } while (puVar20 < puVar2);
    }
    if (uVar34 == 0) {
      uVar34 = uVar33;
    }
    *rep = uVar34;
    if (uVar38 == 0) {
      uVar38 = uVar33;
    }
  }
  rep[1] = uVar38;
  return (long)iEnd - (long)puVar25;
}

Assistant:

static size_t ZSTD_compressBlock_fast_extDict_generic(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize, U32 const mls)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32* const hashTable = ms->hashTable;
    U32 const hlog = cParams->hashLog;
    /* support stepSize of 0 */
    U32 const stepSize = cParams->targetLength + !(cParams->targetLength);
    const BYTE* const base = ms->window.base;
    const BYTE* const dictBase = ms->window.dictBase;
    const BYTE* const istart = (const BYTE*)src;
    const BYTE* ip = istart;
    const BYTE* anchor = istart;
    const U32   endIndex = (U32)((size_t)(istart - base) + srcSize);
    const U32   lowLimit = ZSTD_getLowestMatchIndex(ms, endIndex, cParams->windowLog);
    const U32   dictStartIndex = lowLimit;
    const BYTE* const dictStart = dictBase + dictStartIndex;
    const U32   dictLimit = ms->window.dictLimit;
    const U32   prefixStartIndex = dictLimit < lowLimit ? lowLimit : dictLimit;
    const BYTE* const prefixStart = base + prefixStartIndex;
    const BYTE* const dictEnd = dictBase + prefixStartIndex;
    const BYTE* const iend = istart + srcSize;
    const BYTE* const ilimit = iend - 8;
    U32 offset_1=rep[0], offset_2=rep[1];

    DEBUGLOG(5, "ZSTD_compressBlock_fast_extDict_generic");

    /* switch to "regular" variant if extDict is invalidated due to maxDistance */
    if (prefixStartIndex == dictStartIndex)
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, mls);

    /* Search Loop */
    while (ip < ilimit) {  /* < instead of <=, because (ip+1) */
        const size_t h = ZSTD_hashPtr(ip, hlog, mls);
        const U32    matchIndex = hashTable[h];
        const BYTE* const matchBase = matchIndex < prefixStartIndex ? dictBase : base;
        const BYTE*  match = matchBase + matchIndex;
        const U32    current = (U32)(ip-base);
        const U32    repIndex = current + 1 - offset_1;
        const BYTE* const repBase = repIndex < prefixStartIndex ? dictBase : base;
        const BYTE* const repMatch = repBase + repIndex;
        hashTable[h] = current;   /* update hash table */
        assert(offset_1 <= current +1);   /* check repIndex */

        if ( (((U32)((prefixStartIndex-1) - repIndex) >= 3) /* intentional underflow */ & (repIndex > dictStartIndex))
           && (MEM_read32(repMatch) == MEM_read32(ip+1)) ) {
            const BYTE* const repMatchEnd = repIndex < prefixStartIndex ? dictEnd : iend;
            size_t const rLength = ZSTD_count_2segments(ip+1 +4, repMatch +4, iend, repMatchEnd, prefixStart) + 4;
            ip++;
            ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, 0, rLength-MINMATCH);
            ip += rLength;
            anchor = ip;
        } else {
            if ( (matchIndex < dictStartIndex) ||
                 (MEM_read32(match) != MEM_read32(ip)) ) {
                assert(stepSize >= 1);
                ip += ((ip-anchor) >> kSearchStrength) + stepSize;
                continue;
            }
            {   const BYTE* const matchEnd = matchIndex < prefixStartIndex ? dictEnd : iend;
                const BYTE* const lowMatchPtr = matchIndex < prefixStartIndex ? dictStart : prefixStart;
                U32 const offset = current - matchIndex;
                size_t mLength = ZSTD_count_2segments(ip+4, match+4, iend, matchEnd, prefixStart) + 4;
                while (((ip>anchor) & (match>lowMatchPtr)) && (ip[-1] == match[-1])) { ip--; match--; mLength++; }   /* catch up */
                offset_2 = offset_1; offset_1 = offset;  /* update offset history */
                ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, offset + ZSTD_REP_MOVE, mLength-MINMATCH);
                ip += mLength;
                anchor = ip;
        }   }

        if (ip <= ilimit) {
            /* Fill Table */
            hashTable[ZSTD_hashPtr(base+current+2, hlog, mls)] = current+2;
            hashTable[ZSTD_hashPtr(ip-2, hlog, mls)] = (U32)(ip-2-base);
            /* check immediate repcode */
            while (ip <= ilimit) {
                U32 const current2 = (U32)(ip-base);
                U32 const repIndex2 = current2 - offset_2;
                const BYTE* const repMatch2 = repIndex2 < prefixStartIndex ? dictBase + repIndex2 : base + repIndex2;
                if ( (((U32)((prefixStartIndex-1) - repIndex2) >= 3) & (repIndex2 > dictStartIndex))  /* intentional overflow */
                   && (MEM_read32(repMatch2) == MEM_read32(ip)) ) {
                    const BYTE* const repEnd2 = repIndex2 < prefixStartIndex ? dictEnd : iend;
                    size_t const repLength2 = ZSTD_count_2segments(ip+4, repMatch2+4, iend, repEnd2, prefixStart) + 4;
                    { U32 const tmpOffset = offset_2; offset_2 = offset_1; offset_1 = tmpOffset; }  /* swap offset_2 <=> offset_1 */
                    ZSTD_storeSeq(seqStore, 0 /*litlen*/, anchor, iend, 0 /*offcode*/, repLength2-MINMATCH);
                    hashTable[ZSTD_hashPtr(ip, hlog, mls)] = current2;
                    ip += repLength2;
                    anchor = ip;
                    continue;
                }
                break;
    }   }   }

    /* save reps for next block */
    rep[0] = offset_1;
    rep[1] = offset_2;

    /* Return the last literals size */
    return (size_t)(iend - anchor);
}